

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_libinfo.c
# Opt level: O1

char * proto_token(char *proto)

{
  char **ppcVar1;
  int iVar2;
  char *pcVar3;
  char **ppcVar4;
  
  if (proto == (char *)0x0) {
    return (char *)0x0;
  }
  pcVar3 = *built_in_protos;
  ppcVar4 = built_in_protos;
  while (pcVar3 != (char *)0x0) {
    iVar2 = curl_strequal(pcVar3,proto);
    if (iVar2 != 0) break;
    ppcVar1 = ppcVar4 + 1;
    ppcVar4 = ppcVar4 + 1;
    pcVar3 = *ppcVar1;
  }
  return *ppcVar4;
}

Assistant:

const char *proto_token(const char *proto)
{
  const char * const *builtin;

  if(!proto)
    return NULL;
  for(builtin = built_in_protos; *builtin; builtin++)
    if(curl_strequal(*builtin, proto))
      break;
  return *builtin;
}